

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

bool __thiscall
phmap::priv::
btree<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
::try_merge_or_rebalance
          (btree<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
           *this,iterator *iter)

{
  btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  bVar1;
  btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  bVar2;
  btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *pbVar3;
  node_type *right;
  btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *this_00;
  bool bVar4;
  btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
  *pbVar5;
  int iVar6;
  char *__function;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  
  pbVar5 = iter->node;
  if (((ulong)pbVar5 & 7) != 0) {
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_00284b87;
  }
  pbVar3 = *(btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
             **)pbVar5;
  if ((ulong)(byte)pbVar5[8] == 0) {
LAB_00284a19:
    if ((((ulong)iter->node & 7) == 0) && (((ulong)pbVar3 & 7) == 0)) {
      bVar1 = iter->node[8];
      bVar7 = true;
      if ((byte)bVar1 < (byte)pbVar3[10]) {
        pbVar5 = btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                 ::child(pbVar3,(ulong)(byte)bVar1 + 1);
        if (((ulong)pbVar5 & 7) == 0) {
          if ((pbVar5[0xb] !=
               (btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                )0x0) &&
             (pbVar5[0xb] !=
              (btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
               )0x7)) {
            __assert_fail("right->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xbd0,
                          "bool phmap::priv::btree<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                         );
          }
          this_00 = iter->node;
          if (((ulong)this_00 & 7) == 0) {
            bVar1 = this_00[10];
            bVar2 = pbVar5[10];
            if ((uint)(byte)bVar1 + (uint)(byte)bVar2 + 1 < 8) {
              merge_nodes(this,this_00,pbVar5);
              bVar7 = true;
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if ((byte)bVar2 < 4) {
                bVar7 = true;
              }
              else if ((bVar1 == (btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                                  )0x0) || (bVar7 = true, 0 < iter->position)) {
                iVar8 = (int)((uint)(byte)bVar2 - (uint)(byte)bVar1) / 2;
                iVar6 = (byte)bVar2 - 1;
                if (iVar8 <= iVar6) {
                  iVar6 = iVar8;
                }
                btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                ::rebalance_right_to_left(this_00,iVar6,pbVar5,(allocator_type *)this);
                bVar4 = false;
                bVar7 = false;
              }
            }
            if (!bVar4) {
              return bVar7;
            }
            goto LAB_00284af2;
          }
        }
      }
      else {
LAB_00284af2:
        if (((ulong)iter->node & 7) == 0) {
          uVar9 = (ulong)(byte)iter->node[8];
          if (uVar9 == 0) {
            return false;
          }
          pbVar5 = btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                   ::child(pbVar3,uVar9 - 1);
          if (((ulong)pbVar5 & 7) == 0) {
            bVar1 = pbVar5[10];
            bVar4 = true;
            if ((byte)bVar1 < 4) {
LAB_00284b61:
              if (bVar4) {
                return false;
              }
              return bVar7;
            }
            pbVar3 = iter->node;
            if (((ulong)pbVar3 & 7) == 0) {
              bVar2 = pbVar3[10];
              if ((bVar2 == (btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                             )0x0) || (iter->position < (int)(uint)(byte)bVar2)) {
                iVar8 = (int)((uint)(byte)bVar1 - (uint)(byte)bVar2) / 2;
                iVar6 = (byte)bVar1 - 1;
                if (iVar8 <= (int)((byte)bVar1 - 1)) {
                  iVar6 = iVar8;
                }
                btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
                ::rebalance_left_to_right(pbVar5,iVar6,pbVar3,(allocator_type *)this);
                iter->position = iter->position + iVar6;
                bVar4 = false;
                bVar7 = false;
              }
              goto LAB_00284b61;
            }
          }
        }
      }
    }
  }
  else {
    pbVar5 = btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
             ::child(pbVar3,(ulong)(byte)pbVar5[8] - 1);
    if (((ulong)pbVar5 & 7) == 0) {
      if ((pbVar5[0xb] !=
           (btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
            )0x0) &&
         (pbVar5[0xb] !=
          (btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_true>_>
           )0x7)) {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xbc5,
                      "bool phmap::priv::btree<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>]"
                     );
      }
      right = iter->node;
      if (((ulong)right & 7) == 0) {
        if ((uint)(byte)right[10] + (byte)pbVar5[10] + 1 < 8) {
          iter->position = iter->position + (byte)pbVar5[10] + 1;
          merge_nodes(this,pbVar5,right);
          iter->node = pbVar5;
          return true;
        }
        goto LAB_00284a19;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::CopyableMovableInstance>, std::allocator<std::pair<const phmap::test_internal::CopyableMovableInstance, phmap::test_internal::MovableOnlyInstance>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_00284b87:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

bool btree<P>::try_merge_or_rebalance(iterator *iter) {
        node_type *parent = iter->node->parent();
        if (iter->node->position() > 0) {
            // Try merging with our left sibling.
            node_type *left = parent->child(iter->node->position() - 1);
            assert(left->max_count() == kNodeValues);
            if ((1 + left->count() + iter->node->count()) <= kNodeValues) {
                iter->position += 1 + left->count();
                merge_nodes(left, iter->node);
                iter->node = left;
                return true;
            }
        }
        if (iter->node->position() < parent->count()) {
            // Try merging with our right sibling.
            node_type *right = parent->child(iter->node->position() + 1);
            assert(right->max_count() == kNodeValues);
            if ((1 + iter->node->count() + right->count()) <= kNodeValues) {
                merge_nodes(iter->node, right);
                return true;
            }
            // Try rebalancing with our right sibling. We don't perform rebalancing if
            // we deleted the first element from iter->node and the node is not
            // empty. This is a small optimization for the common pattern of deleting
            // from the front of the tree.
            if ((right->count() > kMinNodeValues) &&
                ((iter->node->count() == 0) ||
                 (iter->position > 0))) {
                int to_move = (right->count() - iter->node->count()) / 2;
                to_move = (std::min)(to_move, right->count() - 1);
                iter->node->rebalance_right_to_left(to_move, right, mutable_allocator());
                return false;
            }
        }
        if (iter->node->position() > 0) {
            // Try rebalancing with our left sibling. We don't perform rebalancing if
            // we deleted the last element from iter->node and the node is not
            // empty. This is a small optimization for the common pattern of deleting
            // from the back of the tree.
            node_type *left = parent->child(iter->node->position() - 1);
            if ((left->count() > kMinNodeValues) &&
                ((iter->node->count() == 0) ||
                 (iter->position < iter->node->count()))) {
                int to_move = (left->count() - iter->node->count()) / 2;
                to_move = (std::min)(to_move, left->count() - 1);
                left->rebalance_left_to_right(to_move, iter->node, mutable_allocator());
                iter->position += to_move;
                return false;
            }
        }
        return false;
    }